

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_expr_unary(CPState *cp,CPValue *k)

{
  CTypeID CVar1;
  CPState *in_RSI;
  CPValue *in_RDI;
  CPState *unaff_retaddr;
  CPValue *in_stack_00000018;
  CPState *in_stack_00000020;
  ErrMsg in_stack_ffffffffffffffec;
  
  CVar1 = in_RDI[0xb].id + 1;
  in_RDI[0xb].id = CVar1;
  if (0x14 < (int)CVar1) {
    cp_err(in_RSI,in_stack_ffffffffffffffec);
  }
  cp_expr_prefix(unaff_retaddr,in_RDI);
  cp_expr_postfix(in_stack_00000020,in_stack_00000018);
  in_RDI[0xb].id = in_RDI[0xb].id - 1;
  return;
}

Assistant:

static void cp_expr_unary(CPState *cp, CPValue *k)
{
  if (++cp->depth > CPARSE_MAX_DECLDEPTH) cp_err(cp, LJ_ERR_XLEVELS);
  cp_expr_prefix(cp, k);
  cp_expr_postfix(cp, k);
  cp->depth--;
}